

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qAverageColor.cpp
# Opt level: O1

uint32_t qAverageColorRGBA8(uint32_t *Pixels,size_t Count)

{
  uint uVar1;
  undefined1 auVar2 [16];
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  undefined1 (*pauVar8) [32];
  undefined1 (*pauVar9) [16];
  ulong uVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  undefined1 auVar18 [16];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar19 [64];
  
  if (Count < 0x10) {
    auVar16 = ZEXT1664((undefined1  [16])0x0);
    uVar5 = 0;
  }
  else {
    auVar16 = ZEXT1664((undefined1  [16])0x0);
    uVar5 = 0;
    auVar17 = vbroadcasti64x4_avx512f(_DAT_00117720);
    auVar12 = vpbroadcastd_avx512f(ZEXT416(0x1010101));
    uVar4 = 0;
    do {
      uVar5 = uVar5 + 0x10;
      auVar19 = ZEXT1664((undefined1  [16])0x0);
      uVar6 = 0;
      do {
        auVar13 = vmovdqu64_avx512f(*(undefined1 (*) [64])(Pixels + (uVar5 - 0x10)));
        auVar13 = vpshufb_avx512bw(auVar13,auVar17);
        auVar19 = vpdpbusd_avx512_vnni(auVar19,auVar13,auVar12);
        uVar7 = uVar6 + 1;
        uVar5 = uVar5 + 0x10;
        if (0x40403e < uVar6) break;
        uVar10 = uVar6 + uVar4 + 1;
        uVar6 = uVar7;
      } while (uVar10 < Count >> 4);
      auVar13 = vpsrlq_avx512f(auVar19,0x20);
      auVar19 = vmovdqa32_avx512f(auVar19);
      auVar14._0_4_ = auVar19._0_4_;
      auVar14._4_4_ = 0;
      auVar14._8_4_ = auVar19._8_4_;
      auVar14._12_4_ = 0;
      auVar14._16_4_ = auVar19._16_4_;
      auVar14._20_4_ = 0;
      auVar14._24_4_ = auVar19._24_4_;
      auVar14._28_4_ = 0;
      auVar14._32_4_ = auVar19._32_4_;
      auVar14._36_4_ = 0;
      auVar14._40_4_ = auVar19._40_4_;
      auVar14._44_4_ = 0;
      auVar14._48_4_ = auVar19._48_4_;
      auVar14._52_4_ = 0;
      auVar14._56_4_ = auVar19._56_4_;
      auVar14._60_4_ = 0;
      auVar16 = vpaddq_avx512f(auVar16,auVar14);
      auVar16 = vpaddq_avx512f(auVar13,auVar16);
      uVar4 = uVar4 + 1 + uVar7;
    } while (uVar4 < Count >> 4);
  }
  auVar11 = vextracti64x4_avx512f(auVar16,1);
  auVar11 = vpaddq_avx2(auVar16._0_32_,auVar11);
  auVar17 = ZEXT3264(auVar11);
  lVar3 = (Count >> 3) - (uVar5 >> 3);
  uVar4 = uVar5;
  if (uVar5 >> 3 <= Count >> 3 && lVar3 != 0) {
    uVar4 = Count & 0xfffffffffffffff8;
    pauVar8 = (undefined1 (*) [32])(Pixels + uVar5);
    do {
      auVar11 = vpermb_avx512vl(_DAT_00117700,*pauVar8);
      auVar11 = vpsadbw_avx2(auVar11,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
      auVar11 = vpaddq_avx2(auVar11,auVar17._0_32_);
      auVar17 = ZEXT3264(auVar11);
      pauVar8 = pauVar8 + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  auVar15 = auVar17._0_16_;
  auVar18 = auVar17._16_16_;
  lVar3 = (Count >> 2) - (uVar4 >> 2);
  uVar5 = uVar4;
  if (uVar4 >> 2 <= Count >> 2 && lVar3 != 0) {
    uVar5 = Count & 0xfffffffffffffffc;
    pauVar9 = (undefined1 (*) [16])(Pixels + uVar4);
    do {
      auVar2 = vmovntdqa_avx(*pauVar9);
      auVar15 = vpshufb_avx(auVar2,_DAT_00117750);
      auVar15 = vpsadbw_avx(auVar15,(undefined1  [16])0x0);
      auVar15 = vpaddq_avx(auVar15,auVar17._0_16_);
      auVar17 = ZEXT1664(auVar15);
      auVar2 = vpshufb_avx(auVar2,_DAT_00117760);
      auVar2 = vpsadbw_avx(auVar2,(undefined1  [16])0x0);
      auVar18 = vpaddq_avx(auVar2,auVar18);
      pauVar9 = pauVar9 + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  uVar4 = auVar15._0_8_;
  uVar10 = vpextrq_avx(auVar15,1);
  uVar7 = auVar18._0_8_;
  uVar6 = vpextrq_avx(auVar18,1);
  if (uVar5 < Count) {
    do {
      uVar1 = Pixels[uVar5];
      uVar6 = uVar6 + (uVar1 >> 0x18);
      uVar7 = uVar7 + ((ulong)(uVar1 >> 0x10) & 0xff);
      uVar10 = uVar10 + (byte)(uVar1 >> 8);
      uVar4 = uVar4 + (byte)uVar1;
      uVar5 = uVar5 + 1;
    } while (Count != uVar5);
  }
  return (int)(uVar6 / Count) << 0x18 | ((uint)(uVar7 / Count) & 0xff) << 0x10 |
         ((uint)(uVar10 / Count) & 0xff) << 8 | (uint)(uVar4 / Count) & 0xff;
}

Assistant:

std::uint32_t qAverageColorRGBA8(
	const std::uint32_t Pixels[],
	std::size_t Count
)
{
	std::size_t i = 0;

#if defined(__AVX512VNNI__) || defined(_MSC_VER)
	// 16 pixels at a time! (AVX512)
	// | ASum64 | BSum64 | GSum64 | RSum64 | ASum64 | BSum64 | GSum64 | RSum64 |
	__m512i RGBASum64x2  = _mm512_setzero_si512();
	for( std::size_t j = i/16; j < Count/16; j++, i += 16 )
	{
		// 32-bit accumulators
		__m512i RGBASum32x4 = _mm512_setzero_si512();
		// In the worst case, where all the bytes are just 0xFF:
		// We are horizontally summing 4 channel-bytes at a time into a 32-bit
		// accumulator. The 32-bit accumulator would overflow after-
		// ( (0xFFFFFFFF / ( 0xFF * 4 ) ) = >>> 0x404040 iterations <<<
		//       ^             ^    ^ Number of bytes summed into accumulator
		//       |             |      at each iteration
		//       |             | a saturated channel bytechannel
		//       | a saturated register is made out of...
		#define SPANDOT4 (0xFFFFFFFF / ( 0xFF * 4 ) )
		for(
			std::size_t k = 0;
			(k < SPANDOT4) && (j < Count/16);
			k++, j++, i += 16
		)
		{
		#undef SPANDOT4
			const __m512i HexadecaPixel = _mm512_loadu_si512((__m512i*)&Pixels[i]);
			// Setting up for vpdpbusd
			__m512i Deinterleave = _mm512_shuffle_epi8(
				HexadecaPixel,
				_mm512_set_epi32(
					// Alpha
					0x3C'38'34'30 + 0x03'03'03'03, 0x2C'28'24'20 + 0x03'03'03'03,
					// Blue
					0x3C'38'34'30 + 0x02'02'02'02, 0x2C'28'24'20 + 0x02'02'02'02,
					// Green
					0x3C'38'34'30 + 0x01'01'01'01, 0x2C'28'24'20 + 0x01'01'01'01,
					// Red
					0x3C'38'34'30 + 0x00'00'00'00, 0x2C'28'24'20 + 0x00'00'00'00,
					// Alpha
					0x1C'18'14'10 + 0x03'03'03'03, 0x0C'08'04'00 + 0x03'03'03'03,
					// Blue
					0x1C'18'14'10 + 0x02'02'02'02, 0x0C'08'04'00 + 0x02'02'02'02,
					// Green
					0x1C'18'14'10 + 0x01'01'01'01, 0x0C'08'04'00 + 0x01'01'01'01,
					// Red
					0x1C'18'14'10 + 0x00'00'00'00, 0x0C'08'04'00 + 0x00'00'00'00
				)
			);
			// VNNI: basically an does a R^4 dot product to each group of
			// 4 bytes into a 32-bit accumulator

			// Dest = Dest + (a[i + 0] * b[i + 0])
			//             + (a[i + 1] * b[i + 1])
			//             + (a[i + 2] * b[i + 2])
			//             + (a[i + 3] * b[i + 3])
			// Dest += + (a[i + 0] * 1)
			//         + (a[i + 1] * 1)
			//         + (a[i + 2] * 1)
			//         + (a[i + 3] * 1)
			// | AAAA | AAAA | BBBB | BBBB | GGGG | GGGG | RRRR | RRRR |
			// | **** | **** | **** | **** | **** | **** | **** | **** |
			// | 1111 | 1111 | 1111 | 1111 | 1111 | 1111 | 1111 | 1111 | x2
			// | hadd | hadd | hadd | hadd | hadd | hadd | hadd | hadd |
			// |ASum32|ASum32|BSum32|BSum32|GSum32|GSum32|RSum32|RSum32|
			RGBASum32x4 = _mm512_dpbusd_epi32(
				RGBASum32x4, Deinterleave, _mm512_set1_epi8(1)
			);
		}
		// Upper Sum32s
		RGBASum64x2 = _mm512_add_epi64(
			RGBASum64x2,
			_mm512_srli_epi64(RGBASum32x4, 32)
		);
		// Lower Sum32s
		RGBASum64x2 = _mm512_add_epi64(
			RGBASum64x2,
			_mm512_maskz_mov_epi32(_cvtu32_mask16(0b0101010101010101), RGBASum32x4)
		);
	}

	// | ASum64 | BSum64 | GSum64 | RSum64 |
	__m256i RGBASum64  = _mm256_add_epi64(
		_mm512_castsi512_si256(RGBASum64x2),
		_mm512_extracti64x4_epi64(RGBASum64x2,1)
	);
#elif defined(__AVX512F__)
	// 16 pixels at a time! (AVX512)
	// | ASum64 | BSum64 | GSum64 | RSum64 | ASum64 | BSum64 | GSum64 | RSum64 |
	__m512i RGBASum64x2  = _mm512_setzero_si512();
	for( std::size_t j = i/16; j < Count/16; j++, i += 16 )
	{
		const __m512i HexadecaPixel = _mm512_loadu_si512((__m512i*)&Pixels[i]);
		// | AAAAAAAA | BBBBBBBB | GGGGGGGG | RRRRRRRR | x2
		// Setting up for 64-bit lane sad_epu8
		__m512i Deinterleave = _mm512_shuffle_epi8(
			HexadecaPixel,
			_mm512_set_epi32(
				// Alpha
				0x3C'38'34'30 + 0x03'03'03'03, 0x2C'28'24'20 + 0x03'03'03'03,
				// Blue
				0x3C'38'34'30 + 0x02'02'02'02, 0x2C'28'24'20 + 0x02'02'02'02,
				// Green
				0x3C'38'34'30 + 0x01'01'01'01, 0x2C'28'24'20 + 0x01'01'01'01,
				// Red
				0x3C'38'34'30 + 0x00'00'00'00, 0x2C'28'24'20 + 0x00'00'00'00,
				// Alpha
				0x1C'18'14'10 + 0x03'03'03'03, 0x0C'08'04'00 + 0x03'03'03'03,
				// Blue
				0x1C'18'14'10 + 0x02'02'02'02, 0x0C'08'04'00 + 0x02'02'02'02,
				// Green
				0x1C'18'14'10 + 0x01'01'01'01, 0x0C'08'04'00 + 0x01'01'01'01,
				// Red
				0x1C'18'14'10 + 0x00'00'00'00, 0x0C'08'04'00 + 0x00'00'00'00
			)
		);
		// | ASum64 | BSum64 | GSum64 | RSum64 |
		RGBASum64x2 = _mm512_add_epi64(
			RGBASum64x2,
			_mm512_sad_epu8(
				Deinterleave,
				_mm512_setzero_si512()
			)
		);
	}

	// | ASum64 | BSum64 | GSum64 | RSum64 |
	__m256i RGBASum64  = _mm256_add_epi64(
		_mm512_castsi512_si256(RGBASum64x2),
		_mm512_extracti64x4_epi64(RGBASum64x2,1)
	);
#else
	__m256i RGBASum64  = _mm256_setzero_si256();
#endif
	// 8 pixels at a time! (AVX/AVX2)
	for( std::size_t j = i/8; j < Count/8; j++, i += 8 )
	{
		const __m256i OctaPixel = _mm256_loadu_si256((__m256i*)&Pixels[i]);
		// Shuffle within 128-bit lanes
		// | ABGRABGRABGRABGR | ABGRABGRABGRABGR |
		// | AAAABBBBGGGGRRRR | AAAABBBBGGGGRRRR |
		// Setting up for 64-bit lane sad_epu8
		__m256i Deinterleave = _mm256_shuffle_epi8(
			OctaPixel,
			_mm256_broadcastsi128_si256(
				_mm_set_epi8(
					// Alpha
					15,11, 7, 3,
					// Blue
					14,10, 6, 2,
					// Green
					13, 9, 5, 1,
					// Red
					12, 8, 4, 0
				)
			)
		);
		// Cross-lane shuffle
		// | AAAABBBBGGGGRRRR | AAAABBBBGGGGRRRR |
		// | AAAAAAAA | BBBBBBBB | GGGGGGGG | RRRRRRRR |
		Deinterleave = _mm256_permutevar8x32_epi32(
			Deinterleave,
			_mm256_set_epi32(
				// Alpha
				7, 3,
				// Blue
				6, 2,
				// Green
				5, 1,
				// Red
				4, 0
			)
		);
		// | ASum64 | BSum64 | GSum64 | RSum64 |
		RGBASum64 = _mm256_add_epi64(
			RGBASum64,
			_mm256_sad_epu8(
				Deinterleave,
				_mm256_setzero_si256()
			)
		);
	}

	// 4 pixels at a time! (SSE)
	__m128i BlueAlphaSum64  = _mm256_extractf128_si256(RGBASum64,1);
	__m128i RedGreenSum64 = _mm256_castsi256_si128(RGBASum64);
	for( std::size_t j = i/4; j < Count/4; j++, i += 4 )
	{
		const __m128i QuadPixel = _mm_stream_load_si128((__m128i*)&Pixels[i]);
		// | GGGGGGGG | RRRRRRRR | GGGGGGGG | RRRRRRRR |
		RedGreenSum64 = _mm_add_epi64(
			RedGreenSum64,
			_mm_sad_epu8(
				_mm_shuffle_epi8(
					QuadPixel,
					_mm_set_epi8(
						// Green
						-1,13,-1, 5,
						-1, 9,-1, 1,
						// Red
						-1,12,-1, 4,
						-1, 8,-1, 0
					)
				),
				_mm_setzero_si128()
			)
		);
		// | AAAAAAAA | BBBBBBBB | AAAAAAAA | BBBBBBBB |
		BlueAlphaSum64 = _mm_add_epi64(
			BlueAlphaSum64,
			_mm_sad_epu8(
				_mm_shuffle_epi8(
					QuadPixel,
					_mm_set_epi8(
						// Alpha
						-1,15,-1, 7,
						-1,11,-1, 3,
						// Blue
						-1,14,-1, 6,
						-1,10,-1, 2
					)
				),
				_mm_setzero_si128()
			)
		);
	}

	// Horizontal sum into just one 64-bit sum now
	std::uint64_t RedSum64 = _mm_cvtsi128_si64(RedGreenSum64);
	std::uint64_t GreenSum64   = _mm_extract_epi64(RedGreenSum64,1);
	std::uint64_t BlueSum64 = _mm_cvtsi128_si64(BlueAlphaSum64);
	std::uint64_t AlphaSum64  = _mm_extract_epi64(BlueAlphaSum64,1);

	// Serial
	for( ; i < Count; ++i )
	{
		const std::uint32_t CurColor = Pixels[i];
		AlphaSum64 += _bextr_u64( CurColor, 24, 8);
		BlueSum64  += _bextr_u64( CurColor, 16, 8);
		// I'm being oddly specific here to make it obvious for the
		// compiler to do some ah/bh/ch/dh register trickery
		//                                              V
		GreenSum64 += static_cast<std::uint8_t>( CurColor >>  8 );
		RedSum64   += static_cast<std::uint8_t>( CurColor       );
	}

	// Average
	RedSum64   /= Count;
	GreenSum64 /= Count;
	BlueSum64  /= Count;
	AlphaSum64 /= Count;

	// Interleave
	return
		(static_cast<std::uint32_t>( (std::uint8_t)AlphaSum64 ) << 24 ) |
		(static_cast<std::uint32_t>( (std::uint8_t) BlueSum64 ) << 16 ) |
		(static_cast<std::uint32_t>( (std::uint8_t)GreenSum64 ) <<  8 ) |
		(static_cast<std::uint32_t>( (std::uint8_t)  RedSum64 ) <<  0 );
}